

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O3

int __thiscall
cmCPackIFWPackage::ConfigureFromGroup(cmCPackIFWPackage *this,cmCPackComponentGroup *group)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pcVar1;
  long lVar2;
  cmCPackLog *this_01;
  _Alloc_hider msg;
  int iVar3;
  long *plVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  size_type *psVar8;
  long *plVar9;
  char *pcVar10;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_1e8;
  long local_1d8;
  long lStack_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (group == (cmCPackComponentGroup *)0x0) {
    iVar3 = 0;
  }
  else {
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_1c8,&group->Name);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x4eb007);
    pcVar1 = local_1a8 + 0x10;
    psVar8 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar8) {
      local_1a8._16_8_ = *psVar8;
      local_1a8._24_8_ = plVar4[3];
      local_1a8._0_8_ = pcVar1;
    }
    else {
      local_1a8._16_8_ = *psVar8;
      local_1a8._0_8_ = (size_type *)*plVar4;
    }
    local_1a8._8_8_ = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(local_1a8);
    local_1e8 = &local_1d8;
    plVar9 = plVar4 + 2;
    if ((long *)*plVar4 == plVar9) {
      local_1d8 = *plVar9;
      lStack_1d0 = plVar4[3];
    }
    else {
      local_1d8 = *plVar9;
      local_1e8 = (long *)*plVar4;
    }
    lVar2 = plVar4[1];
    *plVar4 = (long)plVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::_M_assign((string *)&this->Description);
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>((string *)local_1a8,local_1e8,(long)local_1e8 + lVar2)
    ;
    std::__cxx11::string::append(local_1a8);
    if ((this->Generator == (cmCPackIFWGenerator *)0x0) ||
       (pcVar5 = cmCPackGenerator::GetOption
                           (&this->Generator->super_cmCPackGenerator,(string *)local_1a8),
       pcVar5 == (char *)0x0)) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (char *)0x0;
      if (*pcVar5 != '\0') {
        pcVar10 = pcVar5;
      }
    }
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (pcVar10 == (char *)0x0) {
      local_1a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CPACK_PACKAGE_VERSION","");
      if ((this->Generator == (cmCPackIFWGenerator *)0x0) ||
         (pcVar5 = cmCPackGenerator::GetOption
                             (&this->Generator->super_cmCPackGenerator,(string *)local_1a8),
         pcVar5 == (char *)0x0)) {
        pcVar10 = (char *)0x0;
      }
      else {
        pcVar10 = (char *)0x0;
        if (*pcVar5 != '\0') {
          pcVar10 = pcVar5;
        }
      }
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      pcVar5 = (char *)(this->Version)._M_string_length;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = "1.0.0";
      }
      else {
        strlen(pcVar10);
      }
      std::__cxx11::string::_M_replace((ulong)&this->Version,0,pcVar5,(ulong)pcVar10);
    }
    else {
      pcVar5 = (char *)(this->Version)._M_string_length;
      strlen(pcVar10);
      std::__cxx11::string::_M_replace((ulong)&this->Version,0,pcVar5,(ulong)pcVar10);
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>((string *)local_1a8,local_1e8,(long)local_1e8 + lVar2)
    ;
    std::__cxx11::string::append(local_1a8);
    if ((this->Generator == (cmCPackIFWGenerator *)0x0) ||
       (pcVar5 = cmCPackGenerator::GetOption
                           (&this->Generator->super_cmCPackGenerator,(string *)local_1a8),
       pcVar5 == (char *)0x0)) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (char *)0x0;
      if (*pcVar5 != '\0') {
        pcVar10 = pcVar5;
      }
    }
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (pcVar10 != (char *)0x0) {
      pcVar5 = (char *)(this->Script)._M_string_length;
      strlen(pcVar10);
      std::__cxx11::string::_M_replace((ulong)&this->Script,0,pcVar5,(ulong)pcVar10);
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>((string *)local_1a8,local_1e8,(long)local_1e8 + lVar2)
    ;
    std::__cxx11::string::append(local_1a8);
    if ((this->Generator == (cmCPackIFWGenerator *)0x0) ||
       (pcVar5 = cmCPackGenerator::GetOption
                           (&this->Generator->super_cmCPackGenerator,(string *)local_1a8),
       pcVar5 == (char *)0x0)) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (char *)0x0;
      if (*pcVar5 != '\0') {
        pcVar10 = pcVar5;
      }
    }
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (pcVar10 != (char *)0x0) {
      this_00 = &this->Licenses;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(this_00,(this->Licenses).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
      local_1a8._0_8_ = pcVar1;
      sVar6 = strlen(pcVar10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar10,pcVar10 + sVar6);
      cmSystemTools::ExpandListArgument((string *)local_1a8,this_00,false);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((*(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0x20U) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_1e8,lVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"LICENSES",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," should contain pairs of <display_name> and <file_path>.",0x38);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (this->Generator != (cmCPackIFWGenerator *)0x0) {
          this_01 = (this->Generator->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          msg._M_p = local_1c8._M_dataplus._M_p;
          sVar6 = strlen(local_1c8._M_dataplus._M_p);
          cmCPackLog::Log(this_01,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0x179,msg._M_p,sVar6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(this_00,(this_00->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
      }
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>((string *)local_1a8,local_1e8,(long)local_1e8 + lVar2)
    ;
    std::__cxx11::string::append(local_1a8);
    if ((this->Generator == (cmCPackIFWGenerator *)0x0) ||
       (pcVar5 = cmCPackGenerator::GetOption
                           (&this->Generator->super_cmCPackGenerator,(string *)local_1a8),
       pcVar5 == (char *)0x0)) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (char *)0x0;
      if (*pcVar5 != '\0') {
        pcVar10 = pcVar5;
      }
    }
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (pcVar10 != (char *)0x0) {
      pcVar5 = (char *)(this->SortingPriority)._M_string_length;
      strlen(pcVar10);
      std::__cxx11::string::_M_replace((ulong)&this->SortingPriority,0,pcVar5,(ulong)pcVar10);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int
cmCPackIFWPackage::ConfigureFromGroup(cmCPackComponentGroup *group)
{
  if(!group) return 0;

  // Restore defaul configuration
  DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_GROUP_"
    + cmsys::SystemTools::UpperCase(group->Name)
    + "_";

  DisplayName = group->DisplayName;
  Description = group->Description;

  // Version
  if(const char* optVERSION = GetOption(prefix + "VERSION"))
    {
    Version = optVERSION;
    }
  else if(const char* optPACKAGE_VERSION =
          GetOption("CPACK_PACKAGE_VERSION"))
    {
    Version = optPACKAGE_VERSION;
    }
  else
    {
    Version = "1.0.0";
    }

  // Script
  if (const char* option = GetOption(prefix + "SCRIPT"))
    {
    Script = option;
    }

  // Licenses
  if (const char* option = this->GetOption(prefix + "LICENSES"))
    {
    Licenses.clear();
    cmSystemTools::ExpandListArgument( option, Licenses );
    if ( Licenses.size() % 2 != 0 )
      {
      cmCPackLogger(cmCPackLog::LOG_WARNING, prefix << "LICENSES"
        << " should contain pairs of <display_name> and <file_path>."
        << std::endl);
      Licenses.clear();
      }
    }

  // Priority
  if(const char* option = this->GetOption(prefix + "PRIORITY"))
    {
    SortingPriority = option;
    }

  return 1;
}